

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O1

void __thiscall
rsg::BinaryVecOp<5,_true,_true,_false,_rsg::ComputeAddRange,_rsg::EvaluateAdd>::BinaryVecOp
          (BinaryVecOp<5,_true,_true,_false,_rsg::ComputeAddRange,_rsg::EvaluateAdd> *this,
          GeneratorState *state,Type operatorToken,ConstValueRangeAccess inValueRange)

{
  ValueRange *this_00;
  ValueRange *this_01;
  float *__src;
  int iVar1;
  Type TVar2;
  pointer pSVar3;
  pointer pSVar4;
  ValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  bool bVar5;
  deUint32 dVar6;
  int iVar7;
  pointer pSVar8;
  VariableType *pVVar9;
  VariableType *this_02;
  pointer pSVar10;
  float *aMin;
  pointer pSVar11;
  float *bMin;
  pointer pSVar12;
  float *__src_00;
  long lVar13;
  float *aMax;
  pointer pSVar14;
  pointer pSVar15;
  float *bMax;
  vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> baseTypes;
  Type val;
  ValueRange valueRange;
  __normal_iterator<rsg::VariableType::Type_*,_std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>_>
  local_228;
  __normal_iterator<rsg::VariableType::Type_*,_std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>_>
  in_stack_fffffffffffffde0;
  Type *in_stack_fffffffffffffde8;
  Scalar *in_stack_fffffffffffffdf0;
  long local_1e0;
  ValueRange local_180;
  ValueRange local_100;
  VariableType local_80;
  
  BinaryOp<5,_(rsg::Associativity)0>::BinaryOp
            (&this->super_BinaryOp<5,_(rsg::Associativity)0>,operatorToken);
  (this->super_BinaryOp<5,_(rsg::Associativity)0>).super_Expression._vptr_Expression =
       (_func_int **)&PTR__BinaryOp_0079fff8;
  ValueRange::ValueRange(&local_100,inValueRange);
  if (local_100.m_type.m_baseType == TYPE_VOID) {
    iVar7 = state->m_shaderParams->maxExpressionDepth;
    iVar1 = state->m_expressionDepth;
    local_228._M_current = (Type *)0x0;
    in_stack_fffffffffffffde0._M_current = (Type *)0x0;
    in_stack_fffffffffffffde8 = (Type *)0x0;
    local_180.m_type.m_baseType = TYPE_FLOAT;
    std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::
    _M_realloc_insert<rsg::VariableType::Type>
              ((vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> *)
               &local_228,(iterator)0x0,(Type *)&local_180);
    local_180.m_type.m_baseType = TYPE_INT;
    if (in_stack_fffffffffffffde0._M_current == in_stack_fffffffffffffde8) {
      std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::
      _M_realloc_insert<rsg::VariableType::Type>
                ((vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> *)
                 &local_228,(iterator)in_stack_fffffffffffffde0._M_current,(Type *)&local_180);
    }
    else {
      *in_stack_fffffffffffffde0._M_current = TYPE_INT;
      in_stack_fffffffffffffde0._M_current = in_stack_fffffffffffffde0._M_current + 1;
    }
    local_180.m_type.m_baseType = TYPE_VOID;
    de::Random::
    choose<__gnu_cxx::__normal_iterator<rsg::VariableType::Type*,std::vector<rsg::VariableType::Type,std::allocator<rsg::VariableType::Type>>>,rsg::VariableType::Type*>
              (state->m_random,local_228,in_stack_fffffffffffffde0,(Type *)&local_180,1);
    TVar2 = local_180.m_type.m_baseType;
    dVar6 = deRandom_getUint32(&state->m_random->m_rnd);
    local_80.m_numElements = (dVar6 & (uint)(2 < iVar7 - iVar1) * 3) + 1;
    local_80.m_typeName._M_dataplus._M_p = (pointer)&local_80.m_typeName.field_2;
    local_80.m_baseType = TVar2;
    local_80.m_precision = PRECISION_NONE;
    local_80.m_typeName._M_string_length = 0;
    local_80.m_typeName.field_2._M_local_buf[0] = '\0';
    local_80.m_elementType = (VariableType *)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ValueRange::ValueRange(&local_180,&local_80);
    VariableType::operator=(&local_100.m_type,&local_180.m_type);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&local_100.m_min,&local_180.m_min);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&local_100.m_max,&local_180.m_max);
    ValueRange::~ValueRange(&local_180);
    VariableType::~VariableType(&local_80);
    pSVar8 = local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar8 = (Scalar *)0x0;
    }
    pSVar10 = local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar10 = (Scalar *)0x0;
    }
    valueRange_00.super_ConstValueRangeAccess.m_min = pSVar8;
    valueRange_00.super_ConstValueRangeAccess.m_type = &local_100.m_type;
    valueRange_00.super_ConstValueRangeAccess.m_max = pSVar10;
    computeRandomValueRange(state,valueRange_00);
    if (local_228._M_current != (Type *)0x0) {
      operator_delete(local_228._M_current,
                      (long)in_stack_fffffffffffffde8 - (long)local_228._M_current);
    }
  }
  pVVar9 = &(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type;
  VariableType::operator=(pVVar9,&local_100.m_type);
  iVar7 = VariableType::getScalarSize(pVVar9);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::resize
            (&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_value.m_value,(long)(iVar7 << 6));
  ValueRange::ValueRange(&local_180,pVVar9);
  this_01 = &(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange;
  VariableType::operator=(&this_01->m_type,&local_180.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange.m_min,
             &local_180.m_min);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange.m_max,
             &local_180.m_max);
  ValueRange::~ValueRange(&local_180);
  ValueRange::ValueRange(&local_180,pVVar9);
  this_00 = &(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange;
  VariableType::operator=(&this_00->m_type,&local_180.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange.m_min,
             &local_180.m_min);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange.m_max,
             &local_180.m_max);
  ValueRange::~ValueRange(&local_180);
  if (0 < (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type.m_numElements) {
    TVar2 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type.m_baseType;
    local_1e0 = 0;
    lVar13 = 0;
    do {
      pSVar11 = local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar12 = local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar10 = local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar8 = local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
               .super__Vector_impl_data._M_start;
      VariableType::getElementType(&local_100.m_type);
      if (pSVar12 == pSVar11) {
        pSVar12 = (Scalar *)0x0;
      }
      if (pSVar8 == pSVar10) {
        pSVar8 = (Scalar *)0x0;
      }
      pSVar10 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange.m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar11 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange.m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pSVar14 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange.m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar3 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange.m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pVVar9 = VariableType::getElementType(&this_00->m_type);
      if (pSVar14 == pSVar3) {
        pSVar14 = (pointer)0x0;
      }
      if (pSVar10 == pSVar11) {
        pSVar10 = (pointer)0x0;
      }
      pSVar11 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange.m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar3 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange.m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pSVar15 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange.m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar4 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange.m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      this_02 = VariableType::getElementType(&this_01->m_type);
      __src = (float *)((long)pSVar8 + local_1e0);
      __src_00 = (float *)((long)pSVar12 + local_1e0);
      aMin = (float *)((long)pSVar10 + local_1e0);
      aMax = (float *)((long)pSVar14 + local_1e0);
      if (pSVar15 == pSVar4) {
        pSVar15 = (pointer)0x0;
      }
      if (pSVar11 == pSVar3) {
        pSVar11 = (pointer)0x0;
      }
      bMin = (float *)((long)pSVar11 + local_1e0);
      bMax = (float *)((long)pSVar15 + local_1e0);
      if ((TVar2 - TYPE_FLOAT < 2) &&
         (valueRange_01.m_min = (Scalar *)in_stack_fffffffffffffde8,
         valueRange_01.m_type = (VariableType *)in_stack_fffffffffffffde0._M_current,
         valueRange_01.m_max = in_stack_fffffffffffffdf0,
         bVar5 = isUndefinedValueRange(valueRange_01), bVar5)) {
        iVar7 = VariableType::getScalarSize(pVVar9);
        if (iVar7 != 0) {
          memmove(aMin,__src,(long)iVar7 << 2);
        }
        iVar7 = VariableType::getScalarSize(this_02);
        if (iVar7 != 0) {
          memmove(bMin,__src,(long)iVar7 << 2);
        }
        iVar7 = VariableType::getScalarSize(pVVar9);
        if (iVar7 != 0) {
          memmove(aMax,__src_00,(long)iVar7 << 2);
        }
        iVar7 = VariableType::getScalarSize(this_02);
        if (iVar7 != 0) {
          memmove(bMax,__src_00,(long)iVar7 << 2);
        }
      }
      else if (TVar2 == TYPE_INT) {
        ComputeAddRange::operator()
                  ((ComputeAddRange *)&local_180,state->m_random,(int)*__src,(int)*__src_00,
                   (int *)aMin,(int *)aMax,(int *)bMin,(int *)bMax);
      }
      else if (TVar2 == TYPE_FLOAT) {
        ComputeAddRange::operator()
                  ((ComputeAddRange *)&local_180,state->m_random,*__src,*__src_00,aMin,aMax,bMin,
                   bMax);
      }
      lVar13 = lVar13 + 1;
      local_1e0 = local_1e0 + 4;
    } while (lVar13 < (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type.m_numElements);
  }
  ValueRange::~ValueRange(&local_100);
  return;
}

Assistant:

BinaryVecOp<Precedence, Float, Int, Bool, ComputeValueRange, EvaluateComp>::BinaryVecOp (GeneratorState& state, Token::Type operatorToken, ConstValueRangeAccess inValueRange)
	: BinaryOp<Precedence, ASSOCIATIVITY_LEFT>(operatorToken)
{
	ValueRange valueRange = inValueRange;

	if (valueRange.getType().isVoid())
	{
		int							availableLevels	= state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();
		vector<VariableType::Type>	baseTypes;

		if (Float)	baseTypes.push_back(VariableType::TYPE_FLOAT);
		if (Int)	baseTypes.push_back(VariableType::TYPE_INT);
		if (Bool)	baseTypes.push_back(VariableType::TYPE_BOOL);

		VariableType::Type	baseType	= state.getRandom().choose<VariableType::Type>(baseTypes.begin(), baseTypes.end());
		int					numElements	= state.getRandom().getInt(1, availableLevels >= 3 ? 4 : 1);

		valueRange = ValueRange(VariableType(baseType, numElements));
		computeRandomValueRange(state, valueRange.asAccess());
	}

	// Choose type, allocate storage for execution
	this->m_type = valueRange.getType();
	this->m_value.setStorage(this->m_type);

	// Initialize storage for value ranges
	this->m_rightValueRange	= ValueRange(this->m_type);
	this->m_leftValueRange	= ValueRange(this->m_type);

	VariableType::Type baseType = this->m_type.getBaseType();

	// Compute range for b that satisfies requested value range
	for (int elemNdx = 0; elemNdx < this->m_type.getNumElements(); elemNdx++)
	{
		ConstValueRangeAccess	dst		= valueRange.asAccess().component(elemNdx);
		ValueRangeAccess		a		= this->m_leftValueRange.asAccess().component(elemNdx); // \todo [2011-03-25 pyry] Commutative: randomize inputs
		ValueRangeAccess		b		= this->m_rightValueRange.asAccess().component(elemNdx);

		// Just pass undefined ranges
		if ((baseType == VariableType::TYPE_FLOAT || baseType == VariableType::TYPE_INT) && isUndefinedValueRange(dst))
		{
			a.getMin() = dst.getMin().value();
			b.getMin() = dst.getMin().value();
			a.getMax() = dst.getMax().value();
			b.getMax() = dst.getMax().value();
			continue;
		}

		if (baseType == VariableType::TYPE_FLOAT)
			ComputeValueRange()(state.getRandom(), dst.getMin().asFloat(), dst.getMax().asFloat(),
								a.getMin().asFloat(), a.getMax().asFloat(),
								b.getMin().asFloat(), b.getMax().asFloat());
		else if (baseType == VariableType::TYPE_INT)
			ComputeValueRange()(state.getRandom(), dst.getMin().asInt(), dst.getMax().asInt(),
								a.getMin().asInt(), a.getMax().asInt(),
								b.getMin().asInt(), b.getMax().asInt());
		else
		{
			DE_ASSERT(baseType == VariableType::TYPE_BOOL);
			ComputeValueRange()(state.getRandom(), dst.getMin().asBool(), dst.getMax().asBool(),
								a.getMin().asBool(), a.getMax().asBool(),
								b.getMin().asBool(), b.getMax().asBool());
		}
	}
}